

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O2

section * __thiscall ELFIO::elfio::Sections::add(Sections *this,string *name)

{
  uint uVar1;
  Elf_Word EVar2;
  section *psVar3;
  elfio *peVar4;
  ulong uVar5;
  string_section_accessor str_writer;
  string_section_accessor_template<ELFIO::section> local_48;
  string local_40 [32];
  
  psVar3 = create_section(this->parent);
  std::__cxx11::string::string(local_40,(string *)name);
  (*psVar3->_vptr_section[4])(psVar3,local_40);
  std::__cxx11::string::~string(local_40);
  peVar4 = this->parent;
  if (peVar4->header == (elf_header *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar1 = (*peVar4->header->_vptr_elf_header[0x20])();
    uVar5 = (ulong)(uVar1 & 0xffff);
    peVar4 = this->parent;
  }
  local_48.string_section =
       (peVar4->sections_).super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>.
       _M_impl.super__Vector_impl_data._M_start[uVar5];
  EVar2 = string_section_accessor_template<ELFIO::section>::add_string(&local_48,name);
  (*psVar3->_vptr_section[0x16])(psVar3,(ulong)EVar2);
  return psVar3;
}

Assistant:

section* add( const std::string& name )
        {
            section* new_section = parent->create_section();
            new_section->set_name( name );

            Elf_Half str_index = parent->get_section_name_str_index();
            section* string_table( parent->sections_[str_index] );
            string_section_accessor str_writer( string_table );
            Elf_Word pos = str_writer.add_string( name );
            new_section->set_name_string_offset( pos );

            return new_section;
        }